

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

wchar_t * ConvertToCLangFormat(wchar_t *format,ON_wStringBuffer *clang_format_buffer)

{
  bool bVar1;
  long lVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  
  lVar2 = 0;
  pwVar3 = format;
  do {
    wVar5 = *pwVar3;
    if (wVar5 == L'%') {
      wVar5 = pwVar3[1];
      if (wVar5 == L's') {
        lVar2 = lVar2 + 1;
        pwVar3 = pwVar3 + 2;
      }
      else {
        if (8 < (uint)(wVar5 + L'\xffffffcf')) {
          pwVar3 = pwVar3 + 1;
          goto LAB_005c73eb;
        }
        pwVar3 = pwVar3 + 3;
        do {
          pwVar8 = pwVar3;
          pwVar3 = pwVar8 + 1;
        } while ((uint)(pwVar8[-1] + L'\xffffffd0') < 10);
        pwVar3 = pwVar8 + -1;
        if ((pwVar8[-1] == L'$') && (*pwVar8 == L's')) {
          lVar2 = lVar2 + 1;
          pwVar3 = pwVar8 + 1;
        }
      }
      wVar5 = *pwVar3;
    }
LAB_005c73eb:
    pwVar3 = pwVar3 + 1;
  } while (wVar5 != L'\0');
  pwVar8 = format;
  if (((lVar2 != 0) &&
      (bVar1 = ON_wStringBuffer::GrowBuffer
                         (clang_format_buffer,lVar2 + ((long)pwVar3 - (long)format >> 2) + 1), bVar1
      )) && (pwVar3 = clang_format_buffer->m_buffer, pwVar4 = pwVar3, pwVar3 != (wchar_t *)0x0)) {
    do {
      wVar5 = *format;
      pwVar6 = format;
      pwVar8 = pwVar4;
      if (wVar5 == L'%') {
        pwVar7 = format + 1;
        pwVar8 = pwVar4 + 1;
        *pwVar4 = L'%';
        wVar5 = format[1];
        if (wVar5 == L's') {
LAB_005c7446:
          *pwVar8 = L'l';
          pwVar6 = pwVar6 + 2;
          pwVar4[2] = *pwVar7;
          pwVar4 = pwVar4 + 3;
        }
        else {
          pwVar6 = pwVar7;
          if (8 < (uint)(wVar5 + L'\xffffffcf')) goto LAB_005c7461;
          pwVar4[1] = wVar5;
          pwVar4 = pwVar4 + 2;
          for (pwVar7 = format + 3; wVar5 = pwVar7[-1], (uint)(wVar5 + L'\xffffffd0') < 10;
              pwVar7 = pwVar7 + 1) {
            *pwVar4 = wVar5;
            pwVar4 = pwVar4 + 1;
          }
          pwVar6 = pwVar7 + -1;
          if ((wVar5 == L'$') && (*pwVar7 == L's')) {
            pwVar8 = pwVar4 + 1;
            *pwVar4 = L'$';
            goto LAB_005c7446;
          }
        }
        wVar5 = *pwVar6;
        pwVar8 = pwVar4;
      }
LAB_005c7461:
      format = pwVar6 + 1;
      *pwVar8 = wVar5;
      pwVar4 = pwVar8 + 1;
      pwVar8 = pwVar3;
    } while (wVar5 != L'\0');
  }
  return pwVar8;
}

Assistant:

static const wchar_t* ConvertToCLangFormat(
  const wchar_t* format,
  ON_wStringBuffer& clang_format_buffer
  )
{
  size_t format_capacity = 0;
  const wchar_t* s;
  wchar_t c;

  s = format;
  for(;;)
  {
    if ('%' == *s)
    {
      s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        format_capacity++;
        s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        s++;
        while (*s >= '0' && *s <= '9')
          s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          format_capacity++;
          s++;
          s++;
        }
      }
    }
    if ( 0 == *s++ )
      break;
  }

  if (0 == format_capacity)
    return format;

  format_capacity += (s - format) + 1; // +1 for null terminator

  if ( !clang_format_buffer.GrowBuffer(format_capacity) )
    return format;

  wchar_t* ls = clang_format_buffer.m_buffer; 
  if ( nullptr == ls )
    return format;

  s = format;
  format = ls;
  for(;;)
  {
    if ('%' == *s)
    {
      *ls++ = *s++;
      c = *s;
      if ('s' == c )
      {
        // convert %s to %ls
        *ls++ = 'l';
        *ls++ = *s++;
      }
      else if (c >= '1' && c <= '9')
      {
        // look for %N$s  with N >= 1 ...
        *ls++ = *s++;
        while (*s >= '0' && *s <= '9')
          *ls++ = *s++;
        if ('$' == *s && 's' == s[1] )
        {
          // convert %N$s to %N$ls
          *ls++ = *s++;
          *ls++ = 'l';
          *ls++ = *s++;
        }
      }

    }
    if ( 0 == (*ls++ = *s++) )
      break;
  }

  return format;
}